

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::SSDPRequester::PollLANInfo(SSDPRequester *this)

{
  LANInfo *info;
  pointer pbVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  bool updated;
  Result lanResult;
  error_code ec;
  address multicastIP;
  bool local_1e9;
  Result local_1e8;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [16];
  ostringstream local_190 [376];
  
  info = &this->LAN;
  local_1e9 = false;
  UpdateLANInfo((gateway *)&local_1e8,info,&local_1e9);
  if (local_1e8.Error != (ErrorResult *)0x0) {
    Result::ToJson_abi_cxx11_(&local_1e0,&local_1e8);
    if (DAT_001d8d30 < 4) {
      local_1a0._0_8_ = ModuleLogger;
      local_1a0._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,(string *)&DAT_001d8d60);
      std::operator<<((ostream *)local_190,"Could not get LAN info: ");
      std::operator<<((ostream *)local_190,(string *)&local_1e0);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  if (local_1e9 == true) {
    bVar2 = asio::ip::address::is_unspecified(&info->Gateway);
    this->HaveSeenAGatewayAddress = (bool)(this->HaveSeenAGatewayAddress | !bVar2);
    asio::ip::address::to_string_abi_cxx11_(&local_1e0,&info->Gateway);
    asio::ip::address::to_string_abi_cxx11_(&local_1c0,&(this->LAN).Localhost);
    if (DAT_001d8d30 < 3) {
      local_1a0._0_8_ = ModuleLogger;
      local_1a0._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,(string *)&DAT_001d8d60);
      std::operator<<((ostream *)local_190,"Detected new LAN configuration. Gateway: ");
      std::operator<<((ostream *)local_190,(string *)&local_1e0);
      std::operator<<((ostream *)local_190," LocalIP: ");
      std::operator<<((ostream *)local_190,(string *)&local_1c0);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
    }
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    bVar2 = IsNetworkDefinitelyDown(this);
    if (!bVar2) {
      local_1e0._M_dataplus._M_p._0_4_ = 0;
      local_1e0._M_string_length = std::_V2::system_category();
      asio::ip::make_address((address *)local_1a0,"239.255.255.250",(error_code *)&local_1e0);
      pbVar1 = (this->SSDPAddresses).
               super__Vector_base<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->SSDPAddresses).
          super__Vector_base<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
        (this->SSDPAddresses).
        super__Vector_base<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
      }
      std::
      vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
      ::emplace_back<asio::ip::address_const&,unsigned_short_const&>
                ((vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
                  *)&this->SSDPAddresses,(address *)local_1a0,&kPortSSDP);
      bVar2 = asio::ip::address::is_unspecified(&info->Gateway);
      if (!bVar2) {
        std::
        vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
        ::emplace_back<asio::ip::address&,unsigned_short_const&>
                  ((vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
                    *)&this->SSDPAddresses,&info->Gateway,&kPortSSDP);
      }
      this->AttemptsRemaining = 3;
      StateMachine::OnLANChange(this->State);
    }
  }
  Result::~Result(&local_1e8);
  return;
}

Assistant:

void SSDPRequester::PollLANInfo()
{
    bool updated = false;
    Result lanResult = UpdateLANInfo(LAN, updated);
    if (lanResult.IsFail()) {
        ModuleLogger.Warning("Could not get LAN info: ", lanResult.ToJson());
    }
    if (!updated) {
        return;
    }
    HaveSeenAGatewayAddress |= !LAN.Gateway.is_unspecified();

    ModuleLogger.Info("Detected new LAN configuration. Gateway: ", LAN.Gateway.to_string(),
        " LocalIP: ", LAN.Localhost.to_string());

    // If network is not possibly up
    if (IsNetworkDefinitelyDown()) {
        return;
    }

    // Convert IP string to IP address
    asio::error_code ec;
    const asio::ip::address multicastIP = \
        asio::ip::make_address(kUPnPMulticastAddress, ec);
    TONK_DEBUG_ASSERT(!ec); // Should never happen

    // Send to multicast address
    SSDPAddresses.clear();
    SSDPAddresses.emplace_back(multicastIP, kPortSSDP);

    // If we were able to get the LAN gateway address:
    if (!LAN.Gateway.is_unspecified()) {
        SSDPAddresses.emplace_back(LAN.Gateway, kPortSSDP);
    }

    // Restart SSDP scanning
    BeginSearch();

    // Allow state machine to react to LAN change
    State->OnLANChange();
}